

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall maths::Matrix::rowReduceFromGaussian(Matrix *this)

{
  double **ppdVar1;
  uint uVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  double **extraout_RDX;
  double **ppdVar9;
  int iVar10;
  Matrix *in_RSI;
  uint uVar11;
  ulong uVar12;
  double **ppdVar13;
  long lVar14;
  double dVar15;
  Matrix MVar16;
  
  Matrix(this,in_RSI);
  iVar8 = this->rows_;
  ppdVar9 = extraout_RDX;
  if (0 < (long)iVar8) {
    uVar2 = this->cols_;
    ppdVar9 = (double **)(ulong)(uVar2 - 2);
    ppdVar3 = this->p;
    uVar11 = iVar8 - 2;
    lVar7 = (long)iVar8;
    do {
      pdVar4 = ppdVar3[lVar7 + -1];
      ppdVar13 = ppdVar9;
      if (0 < (int)ppdVar9) {
        do {
          ppdVar1 = (double **)((long)ppdVar13 - 1);
          if (pdVar4[(long)ppdVar13 - 1] != 0.0) {
            ppdVar9 = (double **)((ulong)ppdVar1 & 0xffffffff);
          }
          if (NAN(pdVar4[(long)ppdVar13 - 1])) {
            ppdVar9 = (double **)((ulong)ppdVar1 & 0xffffffff);
          }
          bVar6 = 1 < (long)ppdVar13;
          ppdVar13 = ppdVar1;
        } while (bVar6);
      }
      uVar12 = (ulong)uVar11;
      iVar8 = (int)ppdVar9;
      if ((pdVar4[iVar8] != 0.0) || (NAN(pdVar4[iVar8]))) {
        if (1 < lVar7) {
          do {
            if (0 < (int)uVar2) {
              ppdVar13 = (double **)0x0;
              do {
                if (ppdVar9 != ppdVar13) {
                  pdVar5 = ppdVar3[uVar12];
                  dVar15 = pdVar5[(long)ppdVar13] -
                           (pdVar5[iVar8] / pdVar4[iVar8]) * pdVar4[(long)ppdVar13];
                  pdVar5[(long)ppdVar13] = (double)(~-(ulong)(ABS(dVar15) < 1e-10) & (ulong)dVar15);
                }
                ppdVar13 = (double **)((long)ppdVar13 + 1);
              } while ((double **)(ulong)uVar2 != ppdVar13);
            }
            ppdVar3[uVar12][iVar8] = 0.0;
            iVar10 = (int)uVar12;
            uVar12 = uVar12 - 1;
          } while (0 < iVar10);
        }
        iVar10 = iVar8 + 1;
        if (iVar10 < (int)uVar2) {
          lVar14 = 0;
          do {
            pdVar4[iVar10 + lVar14] =
                 (double)(~-(ulong)(ABS(pdVar4[iVar10 + lVar14] / pdVar4[iVar8]) < 1e-10) &
                         (ulong)(pdVar4[iVar10 + lVar14] / pdVar4[iVar8]));
            lVar14 = lVar14 + 1;
          } while ((uVar2 - 1) - iVar8 != (int)lVar14);
        }
        pdVar4[iVar8] = 1.0;
      }
      ppdVar9 = (double **)(ulong)(iVar8 - 1);
      uVar11 = uVar11 - 1;
      bVar6 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar6);
  }
  MVar16.p = ppdVar9;
  MVar16._0_8_ = this;
  return MVar16;
}

Assistant:

Matrix Matrix::rowReduceFromGaussian()
{
    Matrix R(*this);
    int rows = R.rows_;
    int cols = R.cols_;

    int i = rows - 1; // row tracker
    int j = cols - 2; // column tracker

    // iterate through every row
    while (i >= 0)
    {
        // find the pivot column
        int k = j - 1;
        while (k >= 0) {
            if (R(i, k) != 0)
                j = k;
            k--;
        }

        // zero out elements above pivots if pivot not 0
        if (R(i, j) != 0) {

            for (int t = i - 1; t >= 0; --t) {
                for (int s = 0; s < cols; ++s) {
                    if (s != j) {
                        R(t, s) = R(t, s) - R(i, s) * (R(t, j) / R(i, j));
                        if (R(t, s) < EPS && R(t, s) > -1*EPS)
                            R(t, s) = 0;
                    }
                }
                R(t, j) = 0;
            }

            // divide row by pivot
            for (int k = j + 1; k < cols; ++k) {
                R(i, k) = R(i, k) / R(i, j);
                if (R(i, k) < EPS && R(i, k) > -1*EPS)
                    R(i, k) = 0;
            }
            R(i, j) = 1;

        }

        i--;
        j--;
    }

    return R;
}